

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_const_impl.h
# Opt level: O3

void secp256k1_ecmult_const(secp256k1_gej *r,secp256k1_ge *a,secp256k1_scalar *scalar,int size)

{
  int iVar1;
  ulong uVar2;
  uint64_t uVar3;
  sbyte sVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  secp256k1_ge *psVar14;
  ulong uVar15;
  secp256k1_ge *psVar16;
  ulong uVar17;
  ulong uVar18;
  uint uVar19;
  uint64_t uVar20;
  uint uVar21;
  uint64_t uVar22;
  bool bVar23;
  byte bVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  secp256k1_fe zr [8];
  secp256k1_fe Z;
  secp256k1_ge pre_a [8];
  secp256k1_ge_storage a2_stor;
  int wnaf_1 [65];
  secp256k1_ge correction;
  secp256k1_scalar neg_s;
  uint64_t local_ab0;
  uint64_t local_aa8;
  ulong local_aa0;
  undefined1 local_a78 [16];
  undefined1 local_a68 [16];
  undefined1 local_a48 [48];
  uint64_t uStack_a18;
  undefined1 local_a10 [16];
  ulong local_a00;
  int local_9f8;
  secp256k1_fe local_900;
  secp256k1_ge local_8d8 [8];
  secp256k1_ge_storage local_618;
  secp256k1_ge_storage local_5d8;
  uint auStack_598 [66];
  secp256k1_ge local_490;
  secp256k1_gej local_438 [8];
  
  bVar24 = 0;
  uVar8 = scalar->d[0];
  uVar13 = scalar->d[1];
  uVar17 = scalar->d[2];
  uVar18 = scalar->d[3];
  psVar14 = local_8d8;
  auVar25[0] = -((char)uVar17 == -1);
  auVar25[1] = -((char)(uVar17 >> 8) == -1);
  auVar25[2] = -((char)(uVar17 >> 0x10) == -1);
  auVar25[3] = -((char)(uVar17 >> 0x18) == -1);
  auVar25[4] = -((char)(uVar17 >> 0x20) == -1);
  auVar25[5] = -((char)(uVar17 >> 0x28) == -1);
  auVar25[6] = -((char)(uVar17 >> 0x30) == -1);
  auVar25[7] = -((char)(uVar17 >> 0x38) == -1);
  auVar25[8] = 0xff;
  auVar25[9] = 0xff;
  auVar25[10] = 0xff;
  auVar25[0xb] = 0xff;
  auVar25[0xc] = 0xff;
  auVar25[0xd] = 0xff;
  auVar25[0xe] = 0xff;
  auVar25[0xf] = 0xff;
  uVar12 = (uint)(uVar18 >> 0x3f);
  uVar5 = uVar12 ^ 1;
  uVar9 = 0;
  uVar6 = uVar5;
  if ((ushort)((ushort)(SUB161(auVar25 >> 7,0) & 1) | (ushort)(SUB161(auVar25 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar25 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar25 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar25 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar25 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar25 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar25 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar25 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar25 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar25 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar25 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar25 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar25 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar25 >> 0x77,0) & 1) << 0xe | 0x8000) == 0xffff) {
    uVar6 = 0;
  }
  if (0x5d576e7357a4501c < uVar13) {
    uVar5 = 0;
  }
  uVar6 = (uVar5 | uVar18 < 0x7fffffffffffffff | uVar6) ^ 1;
  uVar5 = 0;
  if (0xdfe92f46681b20a0 < uVar8) {
    uVar5 = uVar6;
  }
  if (0x5d576e7357a4501d < uVar13) {
    uVar5 = uVar6;
  }
  uVar5 = uVar5 | uVar12;
  uVar21 = (uint)uVar8 & 1 ^ uVar5;
  local_8d8[0].x.n[0] = uVar8;
  local_8d8[0].x.n[1] = uVar13;
  local_8d8[0].x.n[2] = uVar17;
  local_8d8[0].x.n[3] = uVar18;
  secp256k1_scalar_negate((secp256k1_scalar *)local_438,(secp256k1_scalar *)psVar14);
  uVar6 = (uint)((((local_438[0].x.n[0] ^ 1) == 0 && local_438[0].x.n[1] == 0) &&
                 local_438[0].x.n[2] == 0) && local_438[0].x.n[3] == 0) * 0x100 + uVar21;
  uVar12 = uVar6 >> 6;
  sVar4 = (sbyte)uVar21;
  uVar2 = (ulong)(uVar6 < 0x40) << sVar4;
  uVar7 = (ulong)(uVar12 == 1) << sVar4;
  uVar15 = (ulong)(uVar12 == 2) << sVar4;
  local_8d8[0].x.n[0] = uVar2 + uVar8;
  uVar8 = (ulong)CARRY8(uVar2,uVar8);
  uVar2 = uVar7 + uVar13;
  local_8d8[0].x.n[1] = uVar2 + uVar8;
  uVar8 = (ulong)(CARRY8(uVar7,uVar13) || CARRY8(uVar2,uVar8));
  uVar13 = uVar15 + uVar17;
  local_8d8[0].x.n[2] = uVar13 + uVar8;
  local_8d8[0].x.n[3] =
       ((ulong)(uVar12 == 3) << sVar4) + uVar18 +
       (ulong)(CARRY8(uVar15,uVar17) || CARRY8(uVar13,uVar8));
  iVar1 = secp256k1_scalar_cond_negate((secp256k1_scalar *)psVar14,uVar5);
  uVar5 = (uint)psVar14;
  iVar11 = -iVar1;
  if ((((local_438[0].x.n[0] ^ 1) != 0 || local_438[0].x.n[1] != 0) || local_438[0].x.n[2] != 0) ||
      local_438[0].x.n[3] != 0) {
    iVar11 = iVar1;
  }
  if (0 < size) {
    uVar13 = local_8d8[0].x.n[3] << 0x3c | local_8d8[0].x.n[2] >> 4;
    uVar8 = local_8d8[0].x.n[2] << 0x3c | local_8d8[0].x.n[1] >> 4;
    uVar17 = local_8d8[0].x.n[1] << 0x3c | local_8d8[0].x.n[0] >> 4;
    uVar9 = (ulong)((size - 1U >> 2) + 1);
    uVar18 = 0;
    uVar3 = local_8d8[0].x.n[3];
    uVar6 = (uint)local_8d8[0].x.n[0] & 0xf;
    do {
      uVar3 = uVar3 >> 4;
      uVar5 = (uint)uVar17;
      uVar17 = uVar17 >> 4 | uVar8 << 0x3c;
      uVar8 = uVar8 >> 4 | uVar13 << 0x3c;
      uVar13 = uVar13 >> 4 | uVar3 << 0x3c;
      uVar19 = ~uVar5 & 1;
      uVar12 = -uVar19;
      if (0 < (int)uVar6) {
        uVar12 = uVar19;
      }
      uVar5 = (uVar5 & 0xf) + uVar12;
      auStack_598[uVar18] = (uVar6 + uVar12 * -0x10) * iVar11;
      uVar18 = uVar18 + 1;
      uVar6 = uVar5;
    } while (uVar9 != uVar18);
  }
  auStack_598[uVar9] = uVar5 * iVar11;
  r->infinity = a->infinity;
  uVar3 = (a->x).n[1];
  uVar20 = (a->x).n[2];
  uVar22 = (a->x).n[3];
  (r->x).n[0] = (a->x).n[0];
  (r->x).n[1] = uVar3;
  (r->x).n[2] = uVar20;
  (r->x).n[3] = uVar22;
  (r->x).n[4] = (a->x).n[4];
  uVar3 = (a->y).n[1];
  uVar20 = (a->y).n[2];
  uVar22 = (a->y).n[3];
  (r->y).n[0] = (a->y).n[0];
  (r->y).n[1] = uVar3;
  (r->y).n[2] = uVar20;
  (r->y).n[3] = uVar22;
  (r->y).n[4] = (a->y).n[4];
  (r->z).n[0] = 1;
  (r->z).n[1] = 0;
  (r->z).n[2] = 0;
  (r->z).n[3] = 0;
  (r->z).n[4] = 0;
  secp256k1_ecmult_odd_multiples_table
            ((int)local_438,(secp256k1_gej *)local_a48,&r->x,(secp256k1_gej *)a);
  secp256k1_ge_globalz_set_table_gej(8,local_8d8,&local_900,local_438,(secp256k1_fe *)local_a48);
  lVar10 = 0x28;
  do {
    secp256k1_fe_normalize_weak((secp256k1_fe *)((long)local_8d8[0].x.n + lVar10));
    lVar10 = lVar10 + 0x58;
  } while (lVar10 != 0x2e8);
  uVar12 = size + 3;
  uVar5 = *(uint *)((long)auStack_598 + (ulong)(uVar12 & 0xfffffffc));
  uVar6 = -uVar5;
  if (uVar5 != uVar6 && SBORROW4(uVar5,uVar6) == (int)(uVar5 * 2) < 0) {
    uVar6 = uVar5;
  }
  lVar10 = 0;
  uVar3 = 0x2e8;
  uVar20 = local_a48._32_8_;
  uVar22 = local_a48._24_8_;
  do {
    bVar23 = (ulong)(uVar6 >> 1) * 0x58 - lVar10 == 0;
    if (bVar23) {
      uVar3 = *(uint64_t *)((long)local_8d8[0].x.n + lVar10);
    }
    if (bVar23) {
      local_a48._8_8_ = *(uint64_t *)((long)local_8d8[0].x.n + lVar10 + 8);
    }
    if (bVar23) {
      local_a48._16_8_ = *(uint64_t *)((long)local_8d8[0].x.n + lVar10 + 0x10);
    }
    if (bVar23) {
      uVar22 = *(uint64_t *)((long)local_8d8[0].x.n + lVar10 + 0x18);
    }
    if (bVar23) {
      uVar20 = *(uint64_t *)((long)local_8d8[0].x.n + lVar10 + 0x20);
    }
    uVar19 = (uint)bVar23;
    auVar33._0_4_ = (int)(uVar19 << 0x1f) >> 0x1f;
    auVar33._4_4_ = (int)(uVar19 << 0x1f) >> 0x1f;
    auVar33._8_4_ = (int)(uVar19 << 0x1f) >> 0x1f;
    auVar33._12_4_ = (int)(uVar19 << 0x1f) >> 0x1f;
    local_a10 = *(undefined1 (*) [16])((long)local_8d8[0].y.n + lVar10 + 0x10) & auVar33 |
                ~auVar33 & local_a10;
    if (bVar23) {
      local_a00 = *(ulong *)((long)local_8d8[0].y.n + lVar10 + 0x20);
    }
    register0x00001240 =
         ~auVar33 & register0x00001240 |
         *(undefined1 (*) [16])((long)local_8d8[0].y.n + lVar10) & auVar33;
    lVar10 = lVar10 + 0x58;
  } while (lVar10 != 0x2c0);
  auVar34._0_8_ = 0x3ffffffffffffc - local_a10._0_8_;
  auVar34._8_8_ = 0x3ffffffffffffc - local_a10._8_8_;
  auVar35._0_8_ = 0x3ffffbfffff0bc - local_a48._40_8_;
  auVar35._8_8_ = 0x3ffffffffffffc - local_a48._48_8_;
  uVar8 = (ulong)(uVar5 >> 0x1f) - 1;
  uVar13 = -(ulong)(uVar5 >> 0x1f);
  auVar29._8_4_ = (int)uVar8;
  auVar29._0_8_ = uVar8;
  auVar29._12_4_ = (int)(uVar8 >> 0x20);
  auVar30._8_4_ = (int)uVar13;
  auVar30._0_8_ = uVar13;
  auVar30._12_4_ = (int)(uVar13 >> 0x20);
  local_a78 = auVar35 & auVar30 | register0x00001240 & auVar29;
  local_a68 = auVar34 & auVar30 | local_a10 & auVar29;
  uVar8 = uVar13 & 0x3fffffffffffc - local_a00 | local_a00 & uVar8;
  r->infinity = 0;
  (r->x).n[4] = uVar20;
  (r->x).n[2] = local_a48._16_8_;
  (r->x).n[3] = uVar22;
  (r->x).n[0] = uVar3;
  (r->x).n[1] = local_a48._8_8_;
  local_a48._40_8_ = local_a78._0_8_;
  uStack_a18 = local_a78._8_8_;
  local_a10._0_8_ = local_a68._0_8_;
  local_a10._8_8_ = local_a68._8_8_;
  (r->y).n[2] = local_a10._0_8_;
  (r->y).n[3] = local_a10._8_8_;
  (r->y).n[4] = uVar8;
  (r->y).n[0] = local_a48._40_8_;
  (r->y).n[1] = uStack_a18;
  (r->z).n[0] = 1;
  (r->z).n[3] = 0;
  (r->z).n[4] = 0;
  (r->z).n[1] = 0;
  (r->z).n[2] = 0;
  local_ab0 = local_a48._16_8_;
  local_aa8 = local_a48._8_8_;
  local_aa0 = (ulong)(uVar12 >> 2);
  local_a48._0_8_ = uVar3;
  local_a48._24_8_ = uVar22;
  local_a48._32_8_ = uVar20;
  unique0x100018c8 = local_a78;
  local_a10 = local_a68;
  local_a00 = uVar8;
  if (3 < uVar12) {
    do {
      iVar11 = 4;
      do {
        secp256k1_gej_double_var(r,r,(secp256k1_fe *)0x0);
        iVar11 = iVar11 + -1;
      } while (iVar11 != 0);
      uVar5 = auStack_598[local_aa0 - 1];
      uVar6 = -uVar5;
      if (uVar5 != uVar6 && SBORROW4(uVar5,uVar6) == (int)(uVar5 * 2) < 0) {
        uVar6 = uVar5;
      }
      lVar10 = 0;
      do {
        bVar23 = (ulong)(uVar6 >> 1) * 0x58 - lVar10 == 0;
        if (bVar23) {
          uVar3 = *(uint64_t *)((long)local_8d8[0].x.n + lVar10);
        }
        if (bVar23) {
          local_aa8 = *(uint64_t *)((long)local_8d8[0].x.n + lVar10 + 8);
        }
        if (bVar23) {
          local_ab0 = *(uint64_t *)((long)local_8d8[0].x.n + lVar10 + 0x10);
        }
        if (bVar23) {
          uVar22 = *(uint64_t *)((long)local_8d8[0].x.n + lVar10 + 0x18);
        }
        if (bVar23) {
          uVar20 = *(uint64_t *)((long)local_8d8[0].x.n + lVar10 + 0x20);
        }
        uVar12 = (uint)bVar23;
        auVar27._0_4_ = (int)(uVar12 << 0x1f) >> 0x1f;
        auVar27._4_4_ = (int)(uVar12 << 0x1f) >> 0x1f;
        auVar27._8_4_ = (int)(uVar12 << 0x1f) >> 0x1f;
        auVar27._12_4_ = (int)(uVar12 << 0x1f) >> 0x1f;
        local_a68 = *(undefined1 (*) [16])((long)local_8d8[0].y.n + lVar10 + 0x10) & auVar27 |
                    ~auVar27 & local_a68;
        if (bVar23) {
          uVar8 = *(ulong *)((long)local_8d8[0].y.n + lVar10 + 0x20);
        }
        local_a78 = ~auVar27 & local_a78 |
                    *(undefined1 (*) [16])((long)local_8d8[0].y.n + lVar10) & auVar27;
        lVar10 = lVar10 + 0x58;
      } while (lVar10 != 0x2c0);
      local_9f8 = 0;
      auVar26._0_8_ = 0x3ffffbfffff0bc - local_a78._0_8_;
      auVar26._8_8_ = 0x3ffffffffffffc - local_a78._8_8_;
      auVar28._0_8_ = 0x3ffffffffffffc - local_a68._0_8_;
      auVar28._8_8_ = 0x3ffffffffffffc - local_a68._8_8_;
      uVar13 = (ulong)(uVar5 >> 0x1f) - 1;
      uVar17 = -(ulong)(uVar5 >> 0x1f);
      auVar31._8_4_ = (int)uVar13;
      auVar31._0_8_ = uVar13;
      auVar31._12_4_ = (int)(uVar13 >> 0x20);
      auVar32._8_4_ = (int)uVar17;
      auVar32._0_8_ = uVar17;
      auVar32._12_4_ = (int)(uVar17 >> 0x20);
      local_a68 = local_a68 & auVar31 | auVar28 & auVar32;
      local_a78 = local_a78 & auVar31 | auVar26 & auVar32;
      uVar8 = uVar8 & uVar13 | uVar17 & 0x3fffffffffffc - uVar8;
      local_a48._0_8_ = uVar3;
      local_a48._8_8_ = local_aa8;
      local_a48._16_8_ = local_ab0;
      local_a48._24_8_ = uVar22;
      local_a48._32_8_ = uVar20;
      unique0x100018b8 = local_a78;
      local_a10 = local_a68;
      local_a00 = uVar8;
      secp256k1_gej_add_ge(r,r,(secp256k1_ge *)local_a48);
      bVar23 = 1 < (long)local_aa0;
      local_aa0 = local_aa0 - 1;
    } while (bVar23);
  }
  secp256k1_fe_mul(&r->z,&r->z,&local_900);
  psVar14 = a;
  psVar16 = &local_490;
  for (lVar10 = 0xb; lVar10 != 0; lVar10 = lVar10 + -1) {
    (psVar16->x).n[0] = (psVar14->x).n[0];
    psVar14 = (secp256k1_ge *)((long)psVar14 + (ulong)bVar24 * -0x10 + 8);
    psVar16 = (secp256k1_ge *)((long)psVar16 + (ulong)bVar24 * -0x10 + 8);
  }
  local_438[0].infinity = local_490.infinity;
  local_438[0].x.n[0] = (a->x).n[0];
  local_438[0].x.n[1] = (a->x).n[1];
  local_438[0].x.n[2] = (a->x).n[2];
  local_438[0].x.n[3] = (a->x).n[3];
  local_438[0].x.n[4] = (a->x).n[4];
  local_438[0].y.n[4] = (a->y).n[4];
  local_438[0].y.n[0] = (a->y).n[0];
  local_438[0].y.n[1] = (a->y).n[1];
  local_438[0].y.n[2] = (a->y).n[2];
  local_438[0].y.n[3] = (a->y).n[3];
  local_438[0].z.n[0] = 1;
  local_438[0].z.n[3] = 0;
  local_438[0].z.n[4] = 0;
  local_438[0].z.n[1] = 0;
  local_438[0].z.n[2] = 0;
  secp256k1_gej_double_var(local_438,local_438,(secp256k1_fe *)0x0);
  secp256k1_ge_set_gej(&local_490,local_438);
  secp256k1_ge_to_storage(&local_5d8,a);
  secp256k1_ge_to_storage(&local_618,&local_490);
  uVar5 = (uint)(uVar21 == 1);
  uVar6 = (int)(uVar5 << 0x1f) >> 0x1f;
  uVar12 = (int)(uVar5 << 0x1f) >> 0x1f;
  uVar21 = (int)(uVar5 << 0x1f) >> 0x1f;
  uVar5 = (int)(uVar5 << 0x1f) >> 0x1f;
  local_5d8.x.n[0]._0_4_ = (uint)local_618.x.n[0] & uVar6 | ~uVar6 & (uint)local_5d8.x.n[0];
  local_5d8.x.n[0]._4_4_ = local_618.x.n[0]._4_4_ & uVar12 | ~uVar12 & local_5d8.x.n[0]._4_4_;
  local_5d8.x.n[1]._0_4_ = (uint)local_618.x.n[1] & uVar21 | ~uVar21 & (uint)local_5d8.x.n[1];
  local_5d8.x.n[1]._4_4_ = local_618.x.n[1]._4_4_ & uVar5 | ~uVar5 & local_5d8.x.n[1]._4_4_;
  local_5d8.x.n[2]._0_4_ = (uint)local_618.x.n[2] & uVar6 | ~uVar6 & (uint)local_5d8.x.n[2];
  local_5d8.x.n[2]._4_4_ = local_618.x.n[2]._4_4_ & uVar12 | ~uVar12 & local_5d8.x.n[2]._4_4_;
  local_5d8.x.n[3]._0_4_ = (uint)local_618.x.n[3] & uVar21 | ~uVar21 & (uint)local_5d8.x.n[3];
  local_5d8.x.n[3]._4_4_ = local_618.x.n[3]._4_4_ & uVar5 | ~uVar5 & local_5d8.x.n[3]._4_4_;
  local_5d8.y.n[0]._0_4_ = (uint)local_618.y.n[0] & uVar6 | ~uVar6 & (uint)local_5d8.y.n[0];
  local_5d8.y.n[0]._4_4_ = local_618.y.n[0]._4_4_ & uVar12 | ~uVar12 & local_5d8.y.n[0]._4_4_;
  local_5d8.y.n[1]._0_4_ = (uint)local_618.y.n[1] & uVar21 | ~uVar21 & (uint)local_5d8.y.n[1];
  local_5d8.y.n[1]._4_4_ = local_618.y.n[1]._4_4_ & uVar5 | ~uVar5 & local_5d8.y.n[1]._4_4_;
  local_5d8.y.n[2]._0_4_ = uVar6 & (uint)local_618.y.n[2] | ~uVar6 & (uint)local_5d8.y.n[2];
  local_5d8.y.n[2]._4_4_ = uVar12 & local_618.y.n[2]._4_4_ | ~uVar12 & local_5d8.y.n[2]._4_4_;
  local_5d8.y.n[3]._0_4_ = uVar21 & (uint)local_618.y.n[3] | ~uVar21 & (uint)local_5d8.y.n[3];
  local_5d8.y.n[3]._4_4_ = uVar5 & local_618.y.n[3]._4_4_ | ~uVar5 & local_5d8.y.n[3]._4_4_;
  secp256k1_ge_from_storage(&local_490,&local_5d8);
  secp256k1_ge_neg(&local_490,&local_490);
  secp256k1_gej_add_ge(r,r,&local_490);
  return;
}

Assistant:

static void secp256k1_ecmult_const(secp256k1_gej *r, const secp256k1_ge *a, const secp256k1_scalar *scalar, int size) {
    secp256k1_ge pre_a[ECMULT_TABLE_SIZE(WINDOW_A)];
    secp256k1_ge tmpa;
    secp256k1_fe Z;

    int skew_1;
#ifdef USE_ENDOMORPHISM
    secp256k1_ge pre_a_lam[ECMULT_TABLE_SIZE(WINDOW_A)];
    int wnaf_lam[1 + WNAF_SIZE(WINDOW_A - 1)];
    int skew_lam;
    secp256k1_scalar q_1, q_lam;
#endif
    int wnaf_1[1 + WNAF_SIZE(WINDOW_A - 1)];

    int i;
    secp256k1_scalar sc = *scalar;

    /* build wnaf representation for q. */
    int rsize = size;
#ifdef USE_ENDOMORPHISM
    if (size > 128) {
        rsize = 128;
        /* split q into q_1 and q_lam (where q = q_1 + q_lam*lambda, and q_1 and q_lam are ~128 bit) */
        secp256k1_scalar_split_lambda(&q_1, &q_lam, &sc);
        skew_1   = secp256k1_wnaf_const(wnaf_1,   q_1,   WINDOW_A - 1, 128);
        skew_lam = secp256k1_wnaf_const(wnaf_lam, q_lam, WINDOW_A - 1, 128);
    } else
#endif
    {
        skew_1   = secp256k1_wnaf_const(wnaf_1, sc, WINDOW_A - 1, size);
#ifdef USE_ENDOMORPHISM
        skew_lam = 0;
#endif
    }

    /* Calculate odd multiples of a.
     * All multiples are brought to the same Z 'denominator', which is stored
     * in Z. Due to secp256k1' isomorphism we can do all operations pretending
     * that the Z coordinate was 1, use affine addition formulae, and correct
     * the Z coordinate of the result once at the end.
     */
    secp256k1_gej_set_ge(r, a);
    secp256k1_ecmult_odd_multiples_table_globalz_windowa(pre_a, &Z, r);
    for (i = 0; i < ECMULT_TABLE_SIZE(WINDOW_A); i++) {
        secp256k1_fe_normalize_weak(&pre_a[i].y);
    }
#ifdef USE_ENDOMORPHISM
    if (size > 128) {
        for (i = 0; i < ECMULT_TABLE_SIZE(WINDOW_A); i++) {
            secp256k1_ge_mul_lambda(&pre_a_lam[i], &pre_a[i]);
        }
    }
#endif

    /* first loop iteration (separated out so we can directly set r, rather
     * than having it start at infinity, get doubled several times, then have
     * its new value added to it) */
    i = wnaf_1[WNAF_SIZE_BITS(rsize, WINDOW_A - 1)];
    VERIFY_CHECK(i != 0);
    ECMULT_CONST_TABLE_GET_GE(&tmpa, pre_a, i, WINDOW_A);
    secp256k1_gej_set_ge(r, &tmpa);
#ifdef USE_ENDOMORPHISM
    if (size > 128) {
        i = wnaf_lam[WNAF_SIZE_BITS(rsize, WINDOW_A - 1)];
        VERIFY_CHECK(i != 0);
        ECMULT_CONST_TABLE_GET_GE(&tmpa, pre_a_lam, i, WINDOW_A);
        secp256k1_gej_add_ge(r, r, &tmpa);
    }
#endif
    /* remaining loop iterations */
    for (i = WNAF_SIZE_BITS(rsize, WINDOW_A - 1) - 1; i >= 0; i--) {
        int n;
        int j;
        for (j = 0; j < WINDOW_A - 1; ++j) {
            secp256k1_gej_double_nonzero(r, r, NULL);
        }

        n = wnaf_1[i];
        ECMULT_CONST_TABLE_GET_GE(&tmpa, pre_a, n, WINDOW_A);
        VERIFY_CHECK(n != 0);
        secp256k1_gej_add_ge(r, r, &tmpa);
#ifdef USE_ENDOMORPHISM
        if (size > 128) {
            n = wnaf_lam[i];
            ECMULT_CONST_TABLE_GET_GE(&tmpa, pre_a_lam, n, WINDOW_A);
            VERIFY_CHECK(n != 0);
            secp256k1_gej_add_ge(r, r, &tmpa);
        }
#endif
    }

    secp256k1_fe_mul(&r->z, &r->z, &Z);

    {
        /* Correct for wNAF skew */
        secp256k1_ge correction = *a;
        secp256k1_ge_storage correction_1_stor;
#ifdef USE_ENDOMORPHISM
        secp256k1_ge_storage correction_lam_stor;
#endif
        secp256k1_ge_storage a2_stor;
        secp256k1_gej tmpj;
        secp256k1_gej_set_ge(&tmpj, &correction);
        secp256k1_gej_double_var(&tmpj, &tmpj, NULL);
        secp256k1_ge_set_gej(&correction, &tmpj);
        secp256k1_ge_to_storage(&correction_1_stor, a);
#ifdef USE_ENDOMORPHISM
        if (size > 128) {
            secp256k1_ge_to_storage(&correction_lam_stor, a);
        }
#endif
        secp256k1_ge_to_storage(&a2_stor, &correction);

        /* For odd numbers this is 2a (so replace it), for even ones a (so no-op) */
        secp256k1_ge_storage_cmov(&correction_1_stor, &a2_stor, skew_1 == 2);
#ifdef USE_ENDOMORPHISM
        if (size > 128) {
            secp256k1_ge_storage_cmov(&correction_lam_stor, &a2_stor, skew_lam == 2);
        }
#endif

        /* Apply the correction */
        secp256k1_ge_from_storage(&correction, &correction_1_stor);
        secp256k1_ge_neg(&correction, &correction);
        secp256k1_gej_add_ge(r, r, &correction);

#ifdef USE_ENDOMORPHISM
        if (size > 128) {
            secp256k1_ge_from_storage(&correction, &correction_lam_stor);
            secp256k1_ge_neg(&correction, &correction);
            secp256k1_ge_mul_lambda(&correction, &correction);
            secp256k1_gej_add_ge(r, r, &correction);
        }
#endif
    }
}